

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  pointer __dest;
  pointer ppTVar1;
  long lVar2;
  size_t __n;
  pointer __src;
  
  __dest = (this->listeners_).
           super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)ppTVar1 - (long)__dest;
  if (__n != 0) {
    lVar2 = ((long)__n >> 3) + (ulong)((long)__n >> 3 == 0);
    do {
      __src = __dest + 1;
      __n = __n - 8;
      if (*__dest == listener) {
        if (__src != ppTVar1) {
          memmove(__dest,__src,__n);
          ppTVar1 = (this->listeners_).
                    super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->listeners_).
        super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar1 + -1;
        return listener;
      }
      lVar2 = lVar2 + -1;
      __dest = __src;
    } while (lVar2 != 0);
  }
  return (TestEventListener *)0x0;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener *listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + i);
      return listener;
    }
  }

  return NULL;
}